

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Point_Object_State_PDU::operator==
          (Point_Object_State_PDU *this,Point_Object_State_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Object_State_Header::operator!=
                    (&this->super_Object_State_Header,&Value->super_Object_State_Header);
  if ((((!KVar1) &&
       ((this->super_Object_State_Header).field_0x4b ==
        (Value->super_Object_State_Header).field_0x4b)) &&
      (KVar1 = DATA_TYPE::ObjectType::operator!=(&this->m_ObjTyp,&Value->m_ObjTyp), !KVar1)) &&
     (((KVar1 = DATA_TYPE::WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc), !KVar1 &&
       (KVar1 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1)) &&
      ((KVar1 = DATA_TYPE::PointObjectAppearance::operator!=(&this->m_Apperance,&Value->m_Apperance)
       , !KVar1 &&
       (KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID), !KVar1)
       ))))) {
    KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_RecvID,&Value->m_RecvID);
    return !KVar1;
  }
  return false;
}

Assistant:

KBOOL Point_Object_State_PDU::operator == ( const Point_Object_State_PDU & Value ) const
{
    if( Object_State_Header::operator  != ( Value ) ) return false;
    if( m_ModificationUnion.m_ui8Modifications != Value.m_ModificationUnion.m_ui8Modifications ) return false;
    if( m_ObjTyp    != Value.m_ObjTyp )       return false;
    if( m_Loc       != Value.m_Loc )          return false;
    if( m_Ori       != Value.m_Ori )          return false;
    if( m_Apperance != Value.m_Apperance )    return false;
    if( m_ReqID     != Value.m_ReqID )        return false;
    if( m_RecvID    != Value.m_RecvID )       return false;
    return true;
}